

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSharedConstructorCode
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  uint uVar2;
  Descriptor *pDVar3;
  undefined4 uVar4;
  undefined8 unaff_RBP;
  long lVar5;
  long lVar6;
  vector<bool,_std::allocator<bool>_> processed;
  allocator_type local_86;
  bool local_85;
  undefined4 local_84;
  vector<bool,_std::allocator<bool>_> local_80;
  vector<bool,_std::allocator<bool>_> local_58;
  
  io::Printer::Print(printer,"void $classname$::SharedCtor() {\n","classname",&this->classname_);
  io::Printer::Indent(printer);
  uVar4 = (undefined4)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
    iVar1 = this->max_has_bit_index_;
    uVar2 = iVar1 + 0x3e;
    if (-1 < (int)(iVar1 + 0x1fU)) {
      uVar2 = iVar1 + 0x1fU;
    }
    if ((0xffffffc0 < iVar1 - 1U) || ((uVar2 >> 5 & 1) != 0)) {
      io::Printer::Print(printer,"_cached_size_ = 0;\n");
      uVar4 = 0;
    }
  }
  local_85 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_80,
             (long)(this->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,&local_85,&local_86);
  std::vector<bool,_std::allocator<bool>_>::vector(&local_58,&local_80);
  local_84 = uVar4;
  GenerateConstructorBody(this,printer,&local_58,false);
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  pDVar3 = this->descriptor_;
  if (0 < *(int *)(pDVar3 + 0x38)) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      io::Printer::Print(printer,"clear_has_$oneof_name$();\n","oneof_name",
                         *(string **)(*(long *)(pDVar3 + 0x40) + lVar6));
      lVar5 = lVar5 + 1;
      pDVar3 = this->descriptor_;
      lVar6 = lVar6 + 0x30;
    } while (lVar5 < *(int *)(pDVar3 + 0x38));
  }
  if ((char)local_84 != '\0') {
    io::Printer::Print(printer,"_cached_size_ = 0;\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  if (local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateSharedConstructorCode(io::Printer* printer) {
  printer->Print(
    "void $classname$::SharedCtor() {\n",
    "classname", classname_);
  printer->Indent();

  bool need_to_clear_cached_size = true;
  // We reproduce the logic used for laying out _cached_sized_ in the class
  // definition, as to initialize it in-order.
  if (HasFieldPresence(descriptor_->file()) &&
      (HasBitsSize() % 8) != 0) {
    printer->Print("_cached_size_ = 0;\n");
    need_to_clear_cached_size = false;
  }

  std::vector<bool> processed(optimized_order_.size(), false);
  GenerateConstructorBody(printer, processed, false);

  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
        "clear_has_$oneof_name$();\n",
        "oneof_name", descriptor_->oneof_decl(i)->name());
  }

  if (need_to_clear_cached_size) {
    printer->Print("_cached_size_ = 0;\n");
  }

  printer->Outdent();
  printer->Print("}\n\n");
}